

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O3

size_t readutf16le<MemoryReader*>(MemoryReader *rd,Wstring *v,size_t n)

{
  pointer puVar1;
  long lVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  size_type sVar5;
  size_type __n;
  
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(v,n,0);
  uVar3 = (*(rd->super_ReadWriter)._vptr_ReadWriter[2])(rd,(v->_M_dataplus)._M_p,n * 2);
  if ((uVar3 & 1) == 0) {
    __n = 0;
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::resize(v,CONCAT44(extraout_var,uVar3) >> 1,0);
    puVar1 = (v->_M_dataplus)._M_p;
    if (*puVar1 != 0) {
      sVar5 = 0;
      do {
        __n = sVar5 + 1;
        lVar2 = sVar5 + 1;
        sVar5 = __n;
      } while (puVar1[lVar2] != 0);
    }
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::resize(v,__n,0);
    return v->_M_string_length;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "read partial uint16_t";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

size_t readutf16le(PTR rd, std::Wstring& v, size_t n)
{
    v.resize(n);
    size_t nr= rd->read((uint8_t*)&v[0], n*sizeof(uint16_t));
    if (nr%sizeof(uint16_t))
        throw "read partial uint16_t";
    v.resize(nr/sizeof(uint16_t));
    v.resize(stringlength(&v[0]));
#if __BYTE_ORDER == __BIG_ENDIAN
#ifdef __GXX_EXPERIMENTAL_CXX0X__
    std::for_each(v.begin(), v.end(), [](uint16_t& x) { x= swab16(x);});
#else
    throw "need c++0x";
#endif
#endif

    return v.size();
}